

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCuts.c
# Opt level: O2

int Aig_CutCheckDominance(Aig_Cut_t *pDom,Aig_Cut_t *pCut)

{
  char cVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  bVar2 = pDom->nFanins;
  uVar3 = 0;
  if ((char)bVar2 < '\x01') {
    bVar2 = 0;
  }
  do {
    if (uVar3 == bVar2) {
      return 1;
    }
    cVar1 = pCut->nFanins;
    uVar4 = 0;
    if ('\0' < cVar1) {
      uVar4 = (ulong)(uint)(int)cVar1;
    }
    for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      if (*(int *)((long)&pDom[1].pNext + uVar3 * 4) == *(int *)((long)&pCut[1].pNext + uVar5 * 4))
      {
        uVar4 = uVar5 & 0xffffffff;
        break;
      }
    }
    uVar3 = uVar3 + 1;
    if ((uint)uVar4 == (int)cVar1) {
      return 0;
    }
  } while( true );
}

Assistant:

static inline int Aig_CutCheckDominance( Aig_Cut_t * pDom, Aig_Cut_t * pCut )
{
    int i, k;
    for ( i = 0; i < (int)pDom->nFanins; i++ )
    {
        for ( k = 0; k < (int)pCut->nFanins; k++ )
            if ( pDom->pFanins[i] == pCut->pFanins[k] )
                break;
        if ( k == (int)pCut->nFanins ) // node i in pDom is not contained in pCut
            return 0;
    }
    // every node in pDom is contained in pCut
    return 1;
}